

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branching.cpp
# Opt level: O0

void __thiscall
PriorityBranchGroup::PriorityBranchGroup
          (PriorityBranchGroup *this,vec<Branching_*> *_x,VarBranch vb)

{
  undefined4 in_EDX;
  BranchGroup *in_RSI;
  undefined8 *in_RDI;
  bool in_stack_ffffffffffffffe3;
  VarBranch in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  
  BranchGroup::BranchGroup
            (in_RSI,(vec<Branching_*> *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
             in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe3);
  *in_RDI = &PTR_finished_0031f808;
  vec<Branching_*>::vec((vec<Branching_*> *)(in_RDI + 7));
  return;
}

Assistant:

PriorityBranchGroup::PriorityBranchGroup(vec<Branching*>& _x, VarBranch vb) : BranchGroup(_x, vb) {}